

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::~PromiseDataBase
          (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *this)

{
  code *pcVar1;
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PromiseDataBase() { }